

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

size_t fmt::v7::detail::count_code_points(basic_string_view<char> s)

{
  size_t sVar1;
  size_t i;
  size_t sVar2;
  
  sVar1 = 0;
  for (sVar2 = 0; s.size_ != sVar2; sVar2 = sVar2 + 1) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

inline size_t count_code_points(basic_string_view<char> s) {
  const char* data = s.data();
  size_t num_code_points = 0;
  for (size_t i = 0, size = s.size(); i != size; ++i) {
    if ((data[i] & 0xc0) != 0x80) ++num_code_points;
  }
  return num_code_points;
}